

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.cpp
# Opt level: O2

pair<embree::NodeRefPtr<4>,_embree::BBox<embree::Vec3fa>_> * __thiscall
embree::avx::GridSOA::buildBVH
          (pair<embree::NodeRefPtr<4>,_embree::BBox<embree::Vec3fa>_> *__return_storage_ptr__,
          GridSOA *this,GridRange *range,size_t *allocator)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined1 (*pauVar9) [16];
  uint u_size;
  int iVar10;
  uint v_size;
  ulong uVar11;
  uint uVar12;
  GridRange *range_00;
  uint u;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  undefined1 local_c8 [16];
  pair<embree::NodeRefPtr<4>,_embree::BBox<embree::Vec3fa>_> node_bounds;
  GridRange local_78;
  undefined1 local_68 [8];
  uint auStack_60 [12];
  
  uVar6 = range->u_start;
  if ((range->u_end - uVar6) + 1 < 4) {
    uVar13 = range->v_start;
    uVar15 = (ulong)uVar13;
    if ((range->v_end - uVar13) + 1 < 4) {
      uVar5 = this->width;
      lVar4 = uVar15 * uVar5;
      uVar11 = (ulong)this->gridOffset;
      iVar7 = uVar13 * uVar5;
      auVar18 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar17 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      while( true ) {
        local_d8 = auVar17._0_16_;
        uVar13 = uVar6;
        if (range->v_end < (uint)uVar15) break;
        for (; uVar13 <= range->u_end; uVar13 = uVar13 + 1) {
          uVar16 = (ulong)(iVar7 + uVar13);
          auVar3 = vinsertps_avx(ZEXT416(*(uint *)(this->data + uVar16 * 4 + uVar11)),
                                 ZEXT416(*(uint *)(this->data +
                                                  uVar16 * 4 + (ulong)this->dim_offset * 4 + uVar11)
                                        ),0x1c);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(this->data +
                                                         uVar16 * 4 +
                                                         (ulong)(this->dim_offset * 2) * 4 + uVar11)
                                               ),0x28);
          auVar2 = vminps_avx(auVar18._0_16_,auVar3);
          auVar18 = ZEXT1664(auVar2);
          auVar3 = vmaxps_avx(auVar17._0_16_,auVar3);
          auVar17 = ZEXT1664(auVar3);
        }
        uVar15 = (ulong)((uint)uVar15 + 1);
        iVar7 = iVar7 + uVar5;
      }
      (__return_storage_ptr__->first).ptr = (lVar4 + (ulong)uVar6) * 0x10 + 0x18;
      (__return_storage_ptr__->second).lower.field_0 = auVar18._0_16_;
      goto LAB_00e9d6c3;
    }
  }
  sVar1 = *allocator;
  *allocator = sVar1 + 0x80;
  *(undefined4 *)(this[2].data + (sVar1 - 0x10)) = 0x7f800000;
  *(undefined4 *)(this[2].data + (sVar1 - 0xc)) = 0x7f800000;
  *(undefined4 *)(this[2].data + (sVar1 - 8)) = 0x7f800000;
  *(undefined4 *)(this[2].data + (sVar1 - 4)) = 0x7f800000;
  *(undefined4 *)(this[2].data + (sVar1 - 0x30)) = 0x7f800000;
  *(undefined4 *)(this[2].data + (sVar1 - 0x2c)) = 0x7f800000;
  *(undefined4 *)(this[2].data + (sVar1 - 0x28)) = 0x7f800000;
  *(undefined4 *)(this[2].data + (sVar1 - 0x24)) = 0x7f800000;
  local_c8._8_4_ = 0x7f800000;
  local_c8._0_8_ = 0x7f8000007f800000;
  local_c8._12_4_ = 0x7f800000;
  *(undefined4 *)(this[1].data + (sVar1 - 0x18)) = 0x7f800000;
  *(undefined4 *)(this[1].data + (sVar1 - 0x14)) = 0x7f800000;
  *(undefined4 *)(this[1].data + (sVar1 - 0x10)) = 0x7f800000;
  *(undefined4 *)(this[1].data + (sVar1 - 0xc)) = 0x7f800000;
  *(undefined4 *)(this[2].data + sVar1) = 0xff800000;
  *(undefined4 *)(this[2].data + sVar1 + 4) = 0xff800000;
  *(undefined4 *)(this[3].data + (sVar1 - 0x30)) = 0xff800000;
  *(undefined4 *)(this[3].data + (sVar1 - 0x2c)) = 0xff800000;
  *(undefined4 *)(this[2].data + (sVar1 - 0x20)) = 0xff800000;
  *(undefined4 *)(this[2].data + (sVar1 - 0x1c)) = 0xff800000;
  *(undefined4 *)(this[2].data + (sVar1 - 0x18)) = 0xff800000;
  *(undefined4 *)(this[2].data + (sVar1 - 0x14)) = 0xff800000;
  local_d8.m128[2] = -INFINITY;
  local_d8._0_8_ = 0xff800000ff800000;
  local_d8.m128[3] = -INFINITY;
  *(undefined4 *)(this[1].data + (sVar1 - 8)) = 0xff800000;
  *(undefined4 *)(this[1].data + (sVar1 - 4)) = 0xff800000;
  *(undefined4 *)(this[1].data + sVar1) = 0xff800000;
  *(undefined4 *)(this[1].data + sVar1 + 4) = 0xff800000;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    *(undefined8 *)(this->data + sVar1 + lVar4 * 8) = 8;
  }
  local_78.u_start = range->u_start;
  uVar6 = range->u_end;
  uVar13 = range->v_end;
  local_78.v_start = range->v_start;
  if ((uVar6 - local_78.u_start) + 1 < (uVar13 - local_78.v_start) + 1) {
    uVar5 = local_78.v_start + uVar13 >> 1;
    uVar8 = local_78.u_start;
    local_78.u_end = uVar6;
    local_78.v_end = uVar5;
  }
  else {
    uVar8 = local_78.u_start + uVar6 >> 1;
    uVar5 = local_78.v_start;
    local_78.u_end = uVar8;
    local_78.v_end = uVar13;
  }
  uVar12 = (local_78.u_end - local_78.u_start) + 1;
  uVar14 = (local_78.v_end - local_78.v_start) + 1;
  if ((uVar14 | uVar12) < 4) {
    iVar7 = 1;
  }
  else {
    auVar3 = vpinsrd_avx(ZEXT416(local_78.u_start),local_78.u_end,1);
    auVar3 = vpinsrd_avx(auVar3,local_78.v_start,2);
    auVar3 = vpinsrd_avx(auVar3,local_78.v_end,3);
    iVar7 = 2;
    if (uVar12 < uVar14) {
      local_78.v_end = local_78.v_end + local_78.v_start >> 1;
      local_78._0_12_ = auVar3._0_12_;
      auStack_60[1] = auVar3._12_4_;
      local_68 = auVar3._0_8_;
      auStack_60[0] = local_78.v_end;
    }
    else {
      local_78.u_end = local_78.u_end + local_78.u_start >> 1;
      local_78._8_8_ = auVar3._8_8_;
      local_78.u_start = auVar3._0_4_;
      stack0xffffffffffffff9c = auVar3._4_12_;
      local_68._0_4_ = local_78.u_end;
    }
  }
  uVar12 = (uVar6 - uVar8) + 1;
  uVar14 = (uVar13 - uVar5) + 1;
  uVar15 = (ulong)(uint)(iVar7 << 4);
  pauVar9 = (undefined1 (*) [16])((long)&local_78.u_start + uVar15);
  if ((uVar12 | uVar14) < 4) {
    iVar10 = 1;
    *(uint *)*pauVar9 = uVar8;
    *(uint *)((long)&local_78.u_end + uVar15) = uVar6;
    *(uint *)((long)&local_78.v_start + uVar15) = uVar5;
    *(uint *)(local_68 + (uVar15 - 4)) = uVar13;
  }
  else {
    auVar3 = vpinsrd_avx(ZEXT416(uVar8),uVar6,1);
    auVar3 = vpinsrd_avx(auVar3,uVar5,2);
    auVar3 = vpinsrd_avx(auVar3,uVar13,3);
    *(undefined1 (*) [16])(local_68 + uVar15) = auVar3;
    *pauVar9 = auVar3;
    if (uVar12 < uVar14) {
      uVar6 = uVar5 + uVar13 >> 1;
      *(uint *)(local_68 + (uVar15 - 4)) = uVar6;
      *(uint *)((long)auStack_60 + uVar15) = uVar6;
    }
    else {
      uVar6 = uVar8 + uVar6 >> 1;
      *(uint *)((long)&local_78.u_end + uVar15) = uVar6;
      *(uint *)(local_68 + uVar15) = uVar6;
    }
    iVar10 = 2;
  }
  range_00 = &local_78;
  for (uVar15 = 0; (uint)(iVar7 + iVar10) != uVar15; uVar15 = uVar15 + 1) {
    buildBVH(&node_bounds,this,range_00,allocator);
    *(float *)(this[1].data + uVar15 * 4 + sVar1 + -0x18) = node_bounds.second.lower.field_0.m128[0]
    ;
    *(float *)(this[2].data + uVar15 * 4 + sVar1 + -0x30) = node_bounds.second.lower.field_0.m128[1]
    ;
    *(float *)(this[2].data + uVar15 * 4 + sVar1 + -0x10) = node_bounds.second.lower.field_0.m128[2]
    ;
    *(float *)(this[1].data + uVar15 * 4 + sVar1 + -8) = node_bounds.second.upper.field_0.m128[0];
    *(float *)(this[2].data + uVar15 * 4 + sVar1 + -0x20) = node_bounds.second.upper.field_0.m128[1]
    ;
    *(float *)(this[2].data + uVar15 * 4 + sVar1) = node_bounds.second.upper.field_0.m128[2];
    *(size_t *)(this->data + uVar15 * 8 + sVar1) = node_bounds.first.ptr;
    auVar3._4_4_ = node_bounds.second.lower.field_0.m128[1];
    auVar3._0_4_ = node_bounds.second.lower.field_0.m128[0];
    auVar3._8_4_ = node_bounds.second.lower.field_0.m128[2];
    auVar3._12_4_ = node_bounds.second.lower.field_0.m128[3];
    local_c8 = vminps_avx(local_c8,auVar3);
    auVar2._4_4_ = node_bounds.second.upper.field_0.m128[1];
    auVar2._0_4_ = node_bounds.second.upper.field_0.m128[0];
    auVar2._8_4_ = node_bounds.second.upper.field_0.m128[2];
    auVar2._12_4_ = node_bounds.second.upper.field_0.m128[3];
    local_d8.m128 = (__m128)vmaxps_avx(local_d8.m128,auVar2);
    range_00 = range_00 + 1;
  }
  (__return_storage_ptr__->first).ptr = (size_t)(this->data + sVar1);
  *(undefined8 *)&(__return_storage_ptr__->second).lower.field_0 = local_c8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->second).lower.field_0 + 8) = local_c8._8_8_;
LAB_00e9d6c3:
  (__return_storage_ptr__->second).upper.field_0 = local_d8;
  return __return_storage_ptr__;
}

Assistant:

std::pair<BVH4::NodeRef,BBox3fa> GridSOA::buildBVH(const GridRange& range, size_t& allocator)
    {
      /*! create leaf node */
      if (unlikely(range.hasLeafSize()))
      {
        /* we store index of first subgrid vertex as leaf node */
        BVH4::NodeRef curNode = BVH4::encodeTypedLeaf(encodeLeaf(range.u_start,range.v_start),0);

        /* return bounding box */
        return std::make_pair(curNode,calculateBounds(0,range));
      }
      
      /* create internal node */
      else 
      {
        /* allocate new bvh4 node */
        BVH4::AABBNode* node = (BVH4::AABBNode *)&bvhData()[allocator];
        allocator += sizeof(BVH4::AABBNode);
        node->clear();
        
        /* split range */
        GridRange r[4];
        const unsigned children = range.splitIntoSubRanges(r);
      
        /* recurse into subtrees */
        BBox3fa bounds( empty );
        for (unsigned i=0; i<children; i++)
        {
          std::pair<BVH4::NodeRef,BBox3fa> node_bounds = buildBVH(r[i], allocator);
          node->set(i,node_bounds.first,node_bounds.second);
          bounds.extend(node_bounds.second);
        }
        assert(is_finite(bounds));
        return std::make_pair(BVH4::encodeNode(node),bounds);
      }
    }